

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O1

void Sbm_AddSorter(sat_solver *p,int *pVars,int i,int k,int *pnVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  long local_40;
  ulong local_38;
  
  iVar1 = *pnVars;
  *pnVars = iVar1 + 2;
  local_40 = (long)i;
  local_48 = (long)k;
  local_38 = (ulong)(uint)pVars[local_48];
  iVar3 = pVars[local_40] * 2 + 1;
  local_54 = iVar1 * 2;
  local_50 = iVar3;
  iVar2 = sat_solver_addclause(p,&local_54,&local_4c);
  if (iVar2 == 0) {
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                  ,0x272,"int sat_solver_add_half_sorter(sat_solver *, int, int, int, int)");
  }
  iVar4 = (int)local_38 * 2 + 1;
  local_54 = iVar1 * 2;
  local_50 = iVar4;
  iVar2 = sat_solver_addclause(p,&local_54,&local_4c);
  if (iVar2 != 0) {
    local_54 = (iVar1 + 1) * 2;
    local_50 = iVar3;
    local_4c = iVar4;
    iVar3 = sat_solver_addclause(p,&local_54,(lit *)&local_48);
    if (iVar3 != 0) {
      pVars[local_40] = iVar1;
      pVars[local_48] = iVar1 + 1;
      return;
    }
    __assert_fail("Cid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                  ,0x27d,"int sat_solver_add_half_sorter(sat_solver *, int, int, int, int)");
  }
  __assert_fail("Cid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                ,0x277,"int sat_solver_add_half_sorter(sat_solver *, int, int, int, int)");
}

Assistant:

static inline void Sbm_AddSorter( sat_solver * p, int * pVars, int i, int k, int * pnVars )
{
    int iVar1 = (*pnVars)++;
    int iVar2 = (*pnVars)++;
    int fVerbose = 0;
    if ( fVerbose )
    {
        int v;
        for ( v = 0; v < i; v++ )
            printf( " " );
        printf( "<" );
        for ( v = i+1; v < k; v++ )
            printf( "-" );
        printf( ">" );
        for ( v = k+1; v < 8; v++ )
            printf( " " );
        printf( "    " );
        printf( "[%3d :%3d ] -> [%3d :%3d ]\n", pVars[i], pVars[k], iVar1, iVar2 );
    }
//    sat_solver_add_and1( p, iVar1, pVars[i], pVars[k], 1, 1, 1 );
//    sat_solver_add_and2( p, iVar2, pVars[i], pVars[k], 0, 0, 0 );
    sat_solver_add_half_sorter( p, iVar1, iVar2, pVars[i], pVars[k] );
    pVars[i] = iVar1;
    pVars[k] = iVar2;
}